

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QArgumentType>::emplace_back_impl<QArgumentType>
          (QVLABase<QArgumentType> *this,qsizetype prealloc,void *array,QArgumentType *args)

{
  QArgumentType *ptr;
  QArgumentType *pQVar1;
  QArgumentType *pQVar2;
  qsizetype in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QArgumentType *in_RDI;
  reference r;
  
  pQVar2 = in_RDI;
  ptr = (QArgumentType *)QVLABaseBase::size((QVLABaseBase *)in_RDI);
  pQVar1 = (QArgumentType *)QVLABaseBase::capacity((QVLABaseBase *)in_RDI);
  if (ptr == pQVar1) {
    growBy((QVLABase<QArgumentType> *)pQVar2,in_RSI,in_RDX,in_RCX);
  }
  end((QVLABase<QArgumentType> *)ptr);
  pQVar2 = q20::construct_at<QArgumentType,QArgumentType,void>(ptr,in_RDI);
  (in_RDI->_name).d.d =
       (Data *)((long)&(((in_RDI->_name).d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + 1);
  return pQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }